

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

value_type *
winmd::reader::ElemSig::read_element
          (value_type *__return_storage_ptr__,database *db,ParamSig *param,byte_view *data)

{
  value_type *pvVar1;
  __index_type _Var2;
  uint uVar3;
  bool bVar4;
  value_type *pvVar5;
  undefined1 extraout_DL;
  byte_view *data_00;
  string_view sVar6;
  TypeDef TVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  add_pointer_t<const_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>_> type_index;
  TypeRef local_78;
  byte local_68;
  undefined7 uStack_67;
  string local_58;
  TypeDef local_38;
  anon_class_16_2_5432fe68 resolve_type;
  
  pvVar1 = &(param->m_type).m_type;
  _Var2 = *(__index_type *)
           ((long)&(param->m_type).m_type.
                   super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
           + 0x38);
  if (_Var2 == '\0') {
    read_primitive(__return_storage_ptr__,
                   *(ElementType *)
                    &(pvVar1->
                     super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     ).
                     super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     ._M_u,data);
    return __return_storage_ptr__;
  }
  type_index = (add_pointer_t<const_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>_>)0x0;
  if (_Var2 != '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "Custom attribute params must be primitives, enums, or System.Type",
               (allocator<char> *)&local_78);
    impl::throw_invalid(&local_58);
  }
  uVar3 = *(uint *)((long)&(param->m_type).m_type.
                           super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   + 8);
  type_index = (add_pointer_t<const_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>_>)pvVar1
  ;
  if ((uVar3 & 3) == 1) {
    local_58._M_dataplus._M_p =
         (pointer)**(undefined8 **)
                    &(pvVar1->
                     super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     ).
                     super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     ._M_u;
    local_58._M_string_length._0_4_ = (uVar3 >> 2) - 1;
    sVar6 = TypeRef::TypeNamespace((TypeRef *)&local_58);
    __y._M_str = "System";
    __y._M_len = 6;
    bVar4 = std::operator==(sVar6,__y);
    if (!bVar4) goto LAB_00143e53;
    local_78.super_row_base<winmd::reader::TypeRef>.m_table =
         (table_base *)
         ((type_index->super_typed_index<winmd::reader::TypeDefOrRef>).
          super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database;
    local_78.super_row_base<winmd::reader::TypeRef>.m_index =
         ((type_index->super_typed_index<winmd::reader::TypeDefOrRef>).
          super_index_base<winmd::reader::TypeDefOrRef>.m_value >> 2) - 1;
    sVar6 = TypeRef::TypeName(&local_78);
    __y_00._M_str = "Type";
    __y_00._M_len = 4;
    bVar4 = std::operator==(sVar6,__y_00);
    if (!bVar4) goto LAB_00143e53;
LAB_00143ede:
    sVar6 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    *(string_view *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ).
      super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ._M_u = sVar6;
    (__return_storage_ptr__->
    super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ).
    super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ._M_index = '\r';
  }
  else {
LAB_00143e53:
    uVar3 = (type_index->super_typed_index<winmd::reader::TypeDefOrRef>).
            super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    if ((uVar3 & 3) == 0) {
      resolve_type.db =
           (database *)
           &((type_index->super_typed_index<winmd::reader::TypeDefOrRef>).
             super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database->TypeDef;
      resolve_type.type_index =
           (add_pointer_t<const_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>_> *)
           CONCAT44(resolve_type.type_index._4_4_,(uVar3 >> 2) - 1);
      sVar6 = TypeDef::TypeNamespace((TypeDef *)&resolve_type);
      __y_01._M_str = "System";
      __y_01._M_len = 6;
      bVar4 = std::operator==(sVar6,__y_01);
      if (bVar4) {
        local_38.super_row_base<winmd::reader::TypeDef>.m_table =
             &(((type_index->super_typed_index<winmd::reader::TypeDefOrRef>).
                super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database->TypeDef).
              super_table_base;
        local_38.super_row_base<winmd::reader::TypeDef>.m_index =
             ((type_index->super_typed_index<winmd::reader::TypeDefOrRef>).
              super_index_base<winmd::reader::TypeDefOrRef>.m_value >> 2) - 1;
        sVar6 = TypeDef::TypeName(&local_38);
        __y_02._M_str = "Type";
        __y_02._M_len = 4;
        bVar4 = std::operator==(sVar6,__y_02);
        if (bVar4) goto LAB_00143ede;
      }
    }
    resolve_type.type_index = &type_index;
    resolve_type.db = db;
    TVar7 = read_element::anon_class_16_2_5432fe68::operator()(&resolve_type);
    local_38.super_row_base<winmd::reader::TypeDef>.m_table =
         TVar7.super_row_base<winmd::reader::TypeDef>.m_table;
    local_38.super_row_base<winmd::reader::TypeDef>.m_index =
         TVar7.super_row_base<winmd::reader::TypeDef>.m_index;
    bVar4 = TypeDef::is_enum(&local_38);
    if (!bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "CustomAttribute params that are TypeDefOrRef must be an enum or System.Type",
                 (allocator<char> *)&local_78);
      impl::throw_invalid(&local_58);
    }
    EnumDefinition::EnumDefinition((EnumDefinition *)&local_58,&local_38);
    local_68 = local_58.field_2._M_local_buf[0];
    local_78.super_row_base<winmd::reader::TypeRef>._12_4_ = local_58._M_string_length._4_4_;
    local_78.super_row_base<winmd::reader::TypeRef>.m_index = (uint32_t)local_58._M_string_length;
    local_78.super_row_base<winmd::reader::TypeRef>.m_table =
         (table_base *)local_58._M_dataplus._M_p;
    pvVar5 = read_enum((value_type *)(ulong)(byte)local_58.field_2._M_local_buf[0],(ElementType)data
                       ,data_00);
    *(table_base **)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ).
      super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ._M_u = local_78.super_row_base<winmd::reader::TypeRef>.m_table;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ).
             super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ._M_u + 8) = local_78.super_row_base<winmd::reader::TypeRef>._8_8_;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      ).
                      super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      ._M_u + 0x10) = CONCAT71(uStack_67,local_68);
    *(value_type **)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ).
             super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ._M_u + 0x18) = pvVar5;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ).
             super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ._M_u + 0x20) = extraout_DL;
    (__return_storage_ptr__->
    super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ).
    super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ._M_index = '\x0e';
  }
  return __return_storage_ptr__;
}

Assistant:

static value_type read_element(database const& db, ParamSig const& param, byte_view& data)
        {
            auto const& type = param.Type().Type();
            if (auto element_type = std::get_if<ElementType>(&type))
            {
                return read_primitive(*element_type, data);
            }
            else if (auto type_index = std::get_if<coded_index<TypeDefOrRef>>(&type))
            {
                if ((type_index->type() == TypeDefOrRef::TypeRef && type_index->TypeRef().TypeNamespace() == "System" && type_index->TypeRef().TypeName() == "Type") ||
                    (type_index->type() == TypeDefOrRef::TypeDef && type_index->TypeDef().TypeNamespace() == "System" && type_index->TypeDef().TypeName() == "Type"))
                {
                    return SystemType{ read<std::string_view>(data) };
                }
                else
                {
                    // Should be an enum. Resolve it.
                    auto resolve_type = [&db, &type_index]() -> TypeDef
                    {
                        if (type_index->type() == TypeDefOrRef::TypeDef)
                        {
                            return type_index->TypeDef();
                        }
                        auto const& typeref = type_index->TypeRef();
                        return db.get_cache().find_required(typeref.TypeNamespace(), typeref.TypeName());
                    };
                    TypeDef const& enum_type = resolve_type();
                    if (!enum_type.is_enum())
                    {
                        impl::throw_invalid("CustomAttribute params that are TypeDefOrRef must be an enum or System.Type");
                    }

                    auto const& enum_def = enum_type.get_enum_definition();
                    return EnumValue{ enum_def, read_enum(enum_def.m_underlying_type, data) };
                }
            }
            impl::throw_invalid("Custom attribute params must be primitives, enums, or System.Type");
        }